

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::LegacyScriptPubKeyMan::DeriveNewChildKey
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CKeyMetadata *metadata,CKey *secret,
          CHDChain *hd_chain,bool internal)

{
  undefined8 uVar1;
  Span<const_std::byte> seed_00;
  byte bVar2;
  bool bVar3;
  runtime_error *prVar4;
  long in_RDX;
  long *in_RDI;
  uint *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  CKey seed;
  CKeyID master_id;
  CExtKey childKey;
  CExtKey chainChildKey;
  CExtKey accountKey;
  CExtKey masterKey;
  CExtKey *in_stack_fffffffffffffc08;
  CHDChain *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined6 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2e;
  undefined1 in_stack_fffffffffffffc2f;
  CKey *in_stack_fffffffffffffc30;
  uint index;
  CExtKey *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  byte in_stack_fffffffffffffc47;
  allocator<char> *in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  undefined6 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5e;
  byte in_stack_fffffffffffffc5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  undefined2 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc82;
  undefined1 in_stack_fffffffffffffc83;
  undefined1 in_stack_fffffffffffffc84 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_339;
  undefined1 local_308 [48];
  string local_2d8 [188];
  undefined1 local_21c [84];
  allocator<char> local_1c8 [96];
  char local_168 [64];
  string local_128 [288];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CKey::CKey((CKey *)in_stack_fffffffffffffc08);
  CExtKey::CExtKey(in_stack_fffffffffffffc08);
  CExtKey::CExtKey(in_stack_fffffffffffffc08);
  CExtKey::CExtKey(in_stack_fffffffffffffc08);
  CExtKey::CExtKey(in_stack_fffffffffffffc08);
  bVar2 = (**(code **)(*in_RDI + 0xf0))(in_RDI,in_R8 + 2,local_308);
  if ((bVar2 & 1) == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc5f,
                        CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)),
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::operator+(in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
    std::runtime_error::runtime_error(prVar4,local_128);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    Span<const_std::byte>::Span<CKey>
              ((Span<const_std::byte> *)in_stack_fffffffffffffc18,(CKey *)in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08);
    seed_00.m_data._2_1_ = in_stack_fffffffffffffc82;
    seed_00.m_data._0_2_ = in_stack_fffffffffffffc80;
    seed_00.m_data._3_1_ = in_stack_fffffffffffffc83;
    seed_00._4_12_ = in_stack_fffffffffffffc84;
    CExtKey::SetSeed((CExtKey *)
                     CONCAT17(in_stack_fffffffffffffc5f,
                              CONCAT16(in_stack_fffffffffffffc5e,in_stack_fffffffffffffc58)),seed_00
                    );
    DeriveExtKey(in_stack_fffffffffffffc38,(uint)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                 (CExtKey *)
                 CONCAT17(in_stack_fffffffffffffc2f,
                          CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
    if ((in_R9B & 1) == 0) {
      bVar2 = 1;
    }
    else {
      bVar2 = (**(code **)(*(long *)in_RDI[1] + 0x30))((long *)in_RDI[1],0x2227c);
      in_stack_fffffffffffffc5f = bVar2;
    }
    if ((bVar2 & 1) == 0) {
      __assert_fail("internal ? m_storage.CanSupportFeature(FEATURE_HD_SPLIT) : true",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x47b,
                    "void wallet::LegacyScriptPubKeyMan::DeriveNewChildKey(WalletBatch &, CKeyMetadata &, CKey &, CHDChain &, bool)"
                   );
    }
    DeriveExtKey(in_stack_fffffffffffffc38,(uint)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                 (CExtKey *)
                 CONCAT17(in_stack_fffffffffffffc2f,
                          CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
    do {
      index = (uint)((ulong)in_stack_fffffffffffffc30 >> 0x20);
      if ((in_R9B & 1) == 0) {
        DeriveExtKey(in_stack_fffffffffffffc38,index,
                     (CExtKey *)
                     CONCAT17(in_stack_fffffffffffffc2f,
                              CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
        util::ToString<unsigned_int>
                  ((uint *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
        std::operator+((char *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        std::operator+(in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
        in_stack_fffffffffffffc48 = local_1c8;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc08);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc08);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc08);
        local_339._M_string_length._1_4_ = 0x80000000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc08,
                   (value_type_conflict3 *)0x3fa744);
        local_339._5_4_ = 0x80000000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc08,
                   (value_type_conflict3 *)0x3fa76a);
        local_339._M_dataplus._M_p._1_4_ = *in_R8 | 0x80000000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc08,
                   (value_type_conflict3 *)0x3fa79b);
        *in_R8 = *in_R8 + 1;
      }
      else {
        DeriveExtKey(in_stack_fffffffffffffc38,index,
                     (CExtKey *)
                     CONCAT17(in_stack_fffffffffffffc2f,
                              CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
        util::ToString<unsigned_int>
                  ((uint *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
        std::operator+((char *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        std::operator+(in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
        in_stack_fffffffffffffc50 = local_168;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc08);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc08);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc08);
        local_339.field_2._5_4_ = 0x80000000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc08,
                   (value_type_conflict3 *)0x3fa5a9);
        local_339.field_2._M_allocated_capacity._1_4_ = 0x80000001;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc08,
                   (value_type_conflict3 *)0x3fa5cf);
        local_339._13_4_ = in_R8[1] | 0x80000000;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc08,
                   (value_type_conflict3 *)0x3fa601);
        in_R8[1] = in_R8[1] + 1;
      }
      CKey::GetPubKey(in_stack_fffffffffffffc30);
      CPubKey::GetID((CPubKey *)in_stack_fffffffffffffc30);
      in_stack_fffffffffffffc47 = (**(code **)(*in_RDI + 0xe8))(in_RDI,local_21c);
    } while ((in_stack_fffffffffffffc47 & 1) != 0);
    CKey::operator=((CKey *)in_stack_fffffffffffffc18,(CKey *)in_stack_fffffffffffffc10);
    *(uint *)(in_RDX + 0x40) = in_R8[6];
    uVar1 = *(undefined8 *)(in_R8 + 4);
    *(undefined8 *)(in_RDX + 0x30) = *(undefined8 *)(in_R8 + 2);
    *(undefined8 *)(in_RDX + 0x38) = uVar1;
    CKey::GetPubKey(in_stack_fffffffffffffc30);
    CPubKey::GetID((CPubKey *)in_stack_fffffffffffffc30);
    base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffffc08);
    base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffffc08);
    std::copy<unsigned_char*,unsigned_char*>
              ((uchar *)CONCAT17(in_stack_fffffffffffffc2f,
                                 CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)),
               (uchar *)in_stack_fffffffffffffc20,(uchar *)in_stack_fffffffffffffc18);
    *(undefined1 *)(in_RDX + 0x68) = 1;
    bVar3 = ::operator==((base_blob<160U> *)in_stack_fffffffffffffc18,
                         (base_blob<160U> *)in_stack_fffffffffffffc10);
    if ((!bVar3) ||
       (bVar3 = WalletBatch::WriteHDChain
                          ((WalletBatch *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10),
       bVar3)) {
      CExtKey::~CExtKey(in_stack_fffffffffffffc08);
      CExtKey::~CExtKey(in_stack_fffffffffffffc08);
      CExtKey::~CExtKey(in_stack_fffffffffffffc08);
      CExtKey::~CExtKey(in_stack_fffffffffffffc08);
      CKey::~CKey((CKey *)in_stack_fffffffffffffc08);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
    }
    else {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      __lhs = &local_339;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc5f,CONCAT16(bVar2,in_stack_fffffffffffffc58)),
                 in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      std::operator+(__lhs,(char *)prVar4);
      std::runtime_error::runtime_error(prVar4,local_2d8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::DeriveNewChildKey(WalletBatch &batch, CKeyMetadata& metadata, CKey& secret, CHDChain& hd_chain, bool internal)
{
    // for now we use a fixed keypath scheme of m/0'/0'/k
    CKey seed;                     //seed (256bit)
    CExtKey masterKey;             //hd master key
    CExtKey accountKey;            //key at m/0'
    CExtKey chainChildKey;         //key at m/0'/0' (external) or m/0'/1' (internal)
    CExtKey childKey;              //key at m/0'/0'/<n>'

    // try to get the seed
    if (!GetKey(hd_chain.seed_id, seed))
        throw std::runtime_error(std::string(__func__) + ": seed not found");

    masterKey.SetSeed(seed);

    // derive m/0'
    // use hardened derivation (child keys >= 0x80000000 are hardened after bip32)
    DeriveExtKey(masterKey, BIP32_HARDENED_KEY_LIMIT, accountKey);

    // derive m/0'/0' (external chain) OR m/0'/1' (internal chain)
    assert(internal ? m_storage.CanSupportFeature(FEATURE_HD_SPLIT) : true);
    DeriveExtKey(accountKey, BIP32_HARDENED_KEY_LIMIT+(internal ? 1 : 0), chainChildKey);

    // derive child key at next index, skip keys already known to the wallet
    do {
        // always derive hardened keys
        // childIndex | BIP32_HARDENED_KEY_LIMIT = derive childIndex in hardened child-index-range
        // example: 1 | BIP32_HARDENED_KEY_LIMIT == 0x80000001 == 2147483649
        if (internal) {
            DeriveExtKey(chainChildKey, hd_chain.nInternalChainCounter | BIP32_HARDENED_KEY_LIMIT, childKey);
            metadata.hdKeypath = "m/0'/1'/" + ToString(hd_chain.nInternalChainCounter) + "'";
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(1 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(hd_chain.nInternalChainCounter | BIP32_HARDENED_KEY_LIMIT);
            hd_chain.nInternalChainCounter++;
        }
        else {
            DeriveExtKey(chainChildKey, hd_chain.nExternalChainCounter | BIP32_HARDENED_KEY_LIMIT, childKey);
            metadata.hdKeypath = "m/0'/0'/" + ToString(hd_chain.nExternalChainCounter) + "'";
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(0 | BIP32_HARDENED_KEY_LIMIT);
            metadata.key_origin.path.push_back(hd_chain.nExternalChainCounter | BIP32_HARDENED_KEY_LIMIT);
            hd_chain.nExternalChainCounter++;
        }
    } while (HaveKey(childKey.key.GetPubKey().GetID()));
    secret = childKey.key;
    metadata.hd_seed_id = hd_chain.seed_id;
    CKeyID master_id = masterKey.key.GetPubKey().GetID();
    std::copy(master_id.begin(), master_id.begin() + 4, metadata.key_origin.fingerprint);
    metadata.has_key_origin = true;
    // update the chain model in the database
    if (hd_chain.seed_id == m_hd_chain.seed_id && !batch.WriteHDChain(hd_chain))
        throw std::runtime_error(std::string(__func__) + ": writing HD chain model failed");
}